

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Skeleton::drawGhost(Skeleton *this)

{
  long in_RDI;
  int dummy;
  Vector3D meshScale;
  Vector3D meshRot;
  Vector3D meshPos;
  Joint *in_stack_00000068;
  Skeleton *in_stack_00000070;
  Vector3D local_50;
  Vector3D local_38;
  Vector3D local_20;
  
  Vector3D::Vector3D(&local_20,(Vector3D *)(*(long *)(in_RDI + 0xf0) + 0x10));
  Vector3D::Vector3D(&local_38,(Vector3D *)(*(long *)(in_RDI + 0xf0) + 0x28));
  Vector3D::Vector3D(&local_50,(Vector3D *)(*(long *)(in_RDI + 0xf0) + 0x40));
  glPushMatrix();
  glTranslated(local_20.x,local_20.y,local_20.z);
  glRotatef((float)local_38.x,0x3f800000,0);
  glRotatef((float)local_38.y,0,0x3f800000);
  glRotatef((float)local_38.z,0,0,0x3f800000);
  glScalef((float)local_50.x,(float)local_50.y,(float)local_50.z);
  drawJoint(this,(Joint *)meshPos.z,(int *)meshPos.y,meshPos.x._7_1_);
  drawCapsule(in_stack_00000070,in_stack_00000068);
  glPopMatrix();
  return;
}

Assistant:

void Skeleton::drawGhost() {
  Vector3D meshPos = mesh->position;
  Vector3D meshRot = mesh->rotation;
  Vector3D meshScale = mesh->scale;
  int dummy;  // not used when pickMode is false, but required

  glPushMatrix();
  glTranslated(meshPos.x, meshPos.y, meshPos.z);
  glRotatef(meshRot.x, 1.0f, 0.0f, 0.0f);
  glRotatef(meshRot.y, 0.0f, 1.0f, 0.0f);
  glRotatef(meshRot.z, 0.0f, 0.0f, 1.0f);
  glScalef(meshScale.x, meshScale.y, meshScale.z);

  drawJoint(root, dummy);
  drawCapsule(root);

  glPopMatrix();
}